

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O2

int convert_16ur(uchar *data,_sample *gus_sample)

{
  uchar *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  short *psVar6;
  ushort *puVar7;
  int *piVar8;
  byte *pbVar9;
  uint uVar10;
  
  uVar4 = gus_sample->data_length;
  uVar10 = uVar4 >> 1;
  psVar6 = (short *)calloc((ulong)uVar10 + 2,2);
  gus_sample->data = psVar6;
  if (psVar6 == (short *)0x0) {
    piVar8 = __errno_location();
    _WM_ERROR("convert_16ur",0x284,1,"to parse sample",*piVar8);
    iVar5 = -1;
  }
  else {
    pbVar9 = data + uVar4;
    puVar7 = (ushort *)(psVar6 + uVar10);
    do {
      puVar7 = puVar7 + -1;
      *puVar7 = (data[1] ^ 0x80) << 8 | (ushort)*data;
      data = data + 2;
    } while (data < pbVar9);
    puVar1 = &gus_sample->loop_fraction;
    *puVar1 = *puVar1 << 4 | *puVar1 >> 4;
    uVar2 = gus_sample->loop_start;
    uVar3 = gus_sample->loop_end;
    gus_sample->loop_start = uVar4 - uVar3 >> 1;
    gus_sample->loop_end = uVar4 - uVar2 >> 1;
    gus_sample->data_length = uVar10;
    gus_sample->modes = gus_sample->modes ^ 0x12;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int convert_16ur(unsigned char *data, struct _sample *gus_sample) {
	unsigned char *read_data = data;
	unsigned char *read_end = data + gus_sample->data_length;
	signed short int *write_data = NULL;
	unsigned long int tmp_loop = 0;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc(((gus_sample->data_length >> 1) + 2),
			sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data + (gus_sample->data_length >> 1) - 1;
		do {
			*write_data = *read_data++;
			*write_data-- |= ((*read_data++) ^ 0x80) << 8;
		} while (read_data < read_end);
		tmp_loop = gus_sample->loop_end;
		gus_sample->loop_end = gus_sample->data_length - gus_sample->loop_start;
		gus_sample->loop_start = gus_sample->data_length - tmp_loop;
		gus_sample->loop_fraction = ((gus_sample->loop_fraction & 0x0f) << 4)
				| ((gus_sample->loop_fraction & 0xf0) >> 4);
		gus_sample->loop_start >>= 1;
		gus_sample->loop_end >>= 1;
		gus_sample->data_length >>= 1;
		gus_sample->modes ^= SAMPLE_REVERSE | SAMPLE_UNSIGNED;
		return 0;
	}
	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}